

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

int32_t __thiscall
icu_63::TimeZoneFormat::parseDefaultOffsetFields
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,UChar separator,int32_t *parsedLen
          )

{
  short sVar1;
  char16_t cVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  undefined6 in_register_0000000a;
  int iVar6;
  int32_t iVar7;
  int offset;
  int32_t len;
  undefined4 local_44;
  TimeZoneFormat *local_40;
  int32_t *local_38;
  
  local_44 = (undefined4)CONCAT62(in_register_0000000a,separator);
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar5 = (text->fUnion).fFields.fLength;
  }
  else {
    iVar5 = (int)sVar1 >> 5;
  }
  len = 0;
  *parsedLen = 0;
  local_40 = this;
  iVar3 = parseOffsetFieldWithLocalizedDigits(this,text,start,'\x01','\x02',0,0x17,&len);
  if (len == 0) {
    return 0;
  }
  offset = len + start;
  iVar6 = len + start + 1;
  iVar7 = 0;
  local_38 = parsedLen;
  if (iVar6 < iVar5) {
    cVar2 = icu_63::UnicodeString::doCharAt(text,offset);
    if (cVar2 != (char16_t)local_44) {
      iVar4 = 0;
      iVar6 = 0;
      goto LAB_002798ad;
    }
    iVar4 = parseOffsetFieldWithLocalizedDigits(local_40,text,iVar6,'\x02','\x02',0,0x3b,&len);
    if (len != 0) {
      offset = iVar6 + len;
      iVar6 = iVar6 + len + 1;
      if (iVar6 < iVar5) {
        cVar2 = icu_63::UnicodeString::doCharAt(text,offset);
        if (cVar2 == (char16_t)local_44) {
          iVar5 = parseOffsetFieldWithLocalizedDigits(local_40,text,iVar6,'\x02','\x02',0,0x3b,&len)
          ;
          if (len != 0) {
            offset = iVar6 + len;
          }
          iVar6 = iVar5 * 1000;
          goto LAB_002798ad;
        }
      }
    }
  }
  else {
    iVar4 = 0;
  }
  iVar6 = 0;
LAB_002798ad:
  if (offset - start != 0) {
    *local_38 = offset - start;
    iVar7 = iVar4 * 60000 + iVar6 + iVar3 * 3600000;
  }
  return iVar7;
}

Assistant:

int32_t
TimeZoneFormat::parseDefaultOffsetFields(const UnicodeString& text, int32_t start, UChar separator, int32_t& parsedLen) const {
    int32_t max = text.length();
    int32_t idx = start;
    int32_t len = 0;
    int32_t hour = 0, min = 0, sec = 0;

    parsedLen = 0;

    do {
        hour = parseOffsetFieldWithLocalizedDigits(text, idx, 1, 2, 0, MAX_OFFSET_HOUR, len);
        if (len == 0) {
            break;
        }
        idx += len;

        if (idx + 1 < max && text.charAt(idx) == separator) {
            min = parseOffsetFieldWithLocalizedDigits(text, idx + 1, 2, 2, 0, MAX_OFFSET_MINUTE, len);
            if (len == 0) {
                break;
            }
            idx += (1 + len);

            if (idx + 1 < max && text.charAt(idx) == separator) {
                sec = parseOffsetFieldWithLocalizedDigits(text, idx + 1, 2, 2, 0, MAX_OFFSET_SECOND, len);
                if (len == 0) {
                    break;
                }
                idx += (1 + len);
            }
        }
    } while (FALSE);

    if (idx == start) {
        return 0;
    }

    parsedLen = idx - start;
    return hour * MILLIS_PER_HOUR + min * MILLIS_PER_MINUTE + sec * MILLIS_PER_SECOND;
}